

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-impl.h
# Opt level: O1

ggml_fp16_t ggml_fp32_to_fp16(float x)

{
  ushort uVar1;
  anon_union_4_2_5fd15f10 fp32_1;
  float base;
  anon_union_4_2_5fd15f10 fp32_2;
  float fVar2;
  
  fVar2 = 2.0;
  if (0x70ffffff < (uint)((int)x * 2)) {
    fVar2 = (float)(((uint)x & 0x7f800000) + 0x7800000);
  }
  fVar2 = fVar2 + (float)((uint)x & (uint)DAT_0014a020) * 5.192297e+33 * 7.70372e-34;
  uVar1 = 0x7e00;
  if ((uint)((int)x * 2) < 0xff000001) {
    uVar1 = (SUB42(fVar2,0) & 0xfff) + ((ushort)((uint)fVar2 >> 0xd) & 0x7c00);
  }
  return uVar1 | (ushort)((uint)x >> 0x10) & 0x8000;
}

Assistant:

static inline uint32_t fp32_to_bits(float f) {
        union {
            float as_value;
            uint32_t as_bits;
        } fp32;
        fp32.as_value = f;
        return fp32.as_bits;
    }